

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void call_wallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat,
                  bool mask)

{
  uint uVar1;
  bool mask_local;
  double yrepeat_local;
  fixed_t *lwal_local;
  float *swal_local;
  short *dwal_local;
  short *uwal_local;
  int x2_local;
  int x1_local;
  
  if (mask) {
    if (colfunc == basecolfunc) {
      maskwallscan(x1,x2,uwal,dwal,swal,lwal,yrepeat,R_GetColumn);
    }
    else {
      transmaskwallscan(x1,x2,uwal,dwal,swal,lwal,yrepeat,R_GetColumn);
    }
  }
  else if ((((fixedcolormap == (lighttable_t *)0x0) && (fixedlightlev < 0)) &&
           (frontsector->e != (extsector_t *)0x0)) &&
          (uVar1 = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist),
          uVar1 != 0)) {
    wallscan_striped(x1,x2,uwal,dwal,swal,lwal,yrepeat);
  }
  else {
    wallscan(x1,x2,uwal,dwal,swal,lwal,yrepeat,R_GetColumn);
  }
  return;
}

Assistant:

static void call_wallscan(int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat, bool mask)
{
	if (mask)
	{
		if (colfunc == basecolfunc)
		{
			maskwallscan(x1, x2, uwal, dwal, swal, lwal, yrepeat);
		}
		else
		{
			transmaskwallscan(x1, x2, uwal, dwal, swal, lwal, yrepeat);
		}
	}
	else
	{
		if (fixedcolormap != NULL || fixedlightlev >= 0 || !(frontsector->e && frontsector->e->XFloor.lightlist.Size()))
		{
			wallscan(x1, x2, uwal, dwal, swal, lwal, yrepeat);
		}
		else
		{
			wallscan_striped(x1, x2, uwal, dwal, swal, lwal, yrepeat);
		}
	}
}